

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void codeApplyAffinity(Parse *pParse,int base,int n,char *zAff)

{
  bool bVar1;
  long lVar2;
  int addr;
  ulong uVar3;
  int iVar4;
  char *pcVar5;
  
  if (zAff == (char *)0x0) {
    return;
  }
  if (0 < n) {
    pcVar5 = zAff + (uint)n;
    iVar4 = n + base;
    do {
      if (*zAff != 'A') goto LAB_0018332b;
      base = base + 1;
      zAff = zAff + 1;
      bVar1 = 1 < n;
      n = n - 1;
    } while (bVar1);
    n = 0;
    zAff = pcVar5;
    base = iVar4;
  }
LAB_0018332b:
  uVar3 = (ulong)(uint)n;
  do {
    iVar4 = (int)uVar3;
    if (iVar4 < 2) {
      if (uVar3 != 1) {
        return;
      }
      break;
    }
    lVar2 = uVar3 - 1;
    uVar3 = uVar3 - 1;
  } while (zAff[lVar2] == 'A');
  addr = sqlite3VdbeAddOp3((Vdbe *)pParse,0x5b,base,iVar4,0);
  sqlite3VdbeChangeP4((Vdbe *)pParse,addr,zAff,iVar4);
  return;
}

Assistant:

static void codeApplyAffinity(Parse *pParse, int base, int n, char *zAff){
  Vdbe *v = pParse->pVdbe;
  if( zAff==0 ){
    assert( pParse->db->mallocFailed );
    return;
  }
  assert( v!=0 );

  /* Adjust base and n to skip over SQLITE_AFF_BLOB entries at the beginning
  ** and end of the affinity string.
  */
  while( n>0 && zAff[0]==SQLITE_AFF_BLOB ){
    n--;
    base++;
    zAff++;
  }
  while( n>1 && zAff[n-1]==SQLITE_AFF_BLOB ){
    n--;
  }

  /* Code the OP_Affinity opcode if there is anything left to do. */
  if( n>0 ){
    sqlite3VdbeAddOp4(v, OP_Affinity, base, n, 0, zAff, n);
  }
}